

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubic_spline.cpp
# Opt level: O0

void __thiscall CubicInterpolation::print(CubicInterpolation *this,ostream *out,string *s)

{
  PointType *c;
  PointType *__end1;
  PointType *__begin1;
  PointType (*__range1) [4];
  string *s_local;
  ostream *out_local;
  CubicInterpolation *this_local;
  
  std::operator<<(out,(string *)s);
  for (__end1 = this->coeffs_; (CubicInterpolation *)__end1 != this + 1; __end1 = __end1 + 1) {
    Eigen::operator<<(out,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)__end1);
  }
  std::operator<<(out,'\n');
  return;
}

Assistant:

void CubicInterpolation::print(std::ostream& out, const std::string& s) const {
  out << s;
  for (const auto& c : coeffs_) {
    out << c;
  }
  out << '\n';
}